

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue_generic_tests.cpp
# Opt level: O0

void density_tests::all_queues_generic_tests
               (TestSettings *i_settings,QueueTesterFlags i_flags,ostream *i_output,
               uint32_t i_random_seed)

{
  initializer_list<unsigned_long> __l;
  bool bVar1;
  allocator<unsigned_long> local_13f1;
  unsigned_long local_13f0;
  iterator local_13e8;
  size_type local_13e0;
  undefined1 local_13d8 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> nonblocking_thread_counts;
  uint64_t cpu_count;
  EasyRandom rand;
  uint32_t i_random_seed_local;
  ostream *i_output_local;
  QueueTesterFlags i_flags_local;
  TestSettings *i_settings_local;
  
  rand._5004_4_ = i_random_seed;
  if (i_random_seed == 0) {
    EasyRandom::EasyRandom((EasyRandom *)&cpu_count);
  }
  else {
    EasyRandom::EasyRandom((EasyRandom *)&cpu_count,i_random_seed);
  }
  nonblocking_thread_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)get_num_of_processors();
  if (nonblocking_thread_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)0x0) {
    nonblocking_thread_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x1;
  }
  local_13f0 = (long)nonblocking_thread_counts.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage << 2;
  local_13e8 = &local_13f0;
  local_13e0 = 1;
  std::allocator<unsigned_long>::allocator(&local_13f1);
  __l._M_len = local_13e0;
  __l._M_array = local_13e8;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_13d8,__l,&local_13f1);
  std::allocator<unsigned_long>::~allocator(&local_13f1);
  bVar1 = TestSettings::should_run(i_settings,"queue");
  if (bVar1) {
    heter_queue_generic_tests
              (i_flags,i_output,(EasyRandom *)&cpu_count,i_settings->m_queue_tests_cardinality);
  }
  bVar1 = TestSettings::should_run(i_settings,"conc_queue");
  if (bVar1) {
    concurr_heter_queue_generic_tests
              (i_flags,i_output,(EasyRandom *)&cpu_count,i_settings->m_queue_tests_cardinality);
  }
  bVar1 = TestSettings::should_run(i_settings,"lf_queue");
  if (bVar1) {
    bVar1 = TestSettings::should_run(i_settings,"relaxed");
    if (bVar1) {
      lf_heter_relaxed_queue_generic_tests
                (i_settings,i_flags,i_output,(EasyRandom *)&cpu_count,
                 (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_13d8);
    }
    bVar1 = TestSettings::should_run(i_settings,"seq_cnst");
    if (bVar1) {
      lf_heter_seq_cst_queue_generic_tests
                (i_settings,i_flags,i_output,(EasyRandom *)&cpu_count,
                 (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_13d8);
    }
  }
  bVar1 = TestSettings::should_run(i_settings,"sp_queue");
  if (bVar1) {
    sp_heter_generic_tests
              (i_flags,i_output,(EasyRandom *)&cpu_count,i_settings->m_queue_tests_cardinality);
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_13d8);
  return;
}

Assistant:

void all_queues_generic_tests(
      const TestSettings & i_settings,
      QueueTesterFlags     i_flags,
      std::ostream &       i_output,
      uint32_t             i_random_seed)
    {
        EasyRandom rand      = i_random_seed == 0 ? EasyRandom() : EasyRandom(i_random_seed);
        uint64_t   cpu_count = get_num_of_processors();
        if (cpu_count == 0)
            cpu_count = 1;

#if defined(__GNUC__) && !defined(__clang__)
        /* on travis gcc builds take more time, so we use lees threads. 
                to do: expose the number of threads with a commandline argument */
        std::vector<size_t> const nonblocking_thread_counts{static_cast<size_t>(cpu_count * 2)};
#else
        std::vector<size_t> const nonblocking_thread_counts{static_cast<size_t>(cpu_count * 4)};
#endif

        if (i_settings.should_run("queue"))
            heter_queue_generic_tests(
              i_flags, i_output, rand, i_settings.m_queue_tests_cardinality);

        if (i_settings.should_run("conc_queue"))
            concurr_heter_queue_generic_tests(
              i_flags, i_output, rand, i_settings.m_queue_tests_cardinality);

        if (i_settings.should_run("lf_queue"))
        {
            if (i_settings.should_run("relaxed"))
                lf_heter_relaxed_queue_generic_tests(
                  i_settings, i_flags, i_output, rand, nonblocking_thread_counts);

            if (i_settings.should_run("seq_cnst"))
                lf_heter_seq_cst_queue_generic_tests(
                  i_settings, i_flags, i_output, rand, nonblocking_thread_counts);
        }

        if (i_settings.should_run("sp_queue"))
            sp_heter_generic_tests(i_flags, i_output, rand, i_settings.m_queue_tests_cardinality);
    }